

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  undefined8 uVar1;
  string *psVar2;
  ostream *poVar3;
  bool bVar4;
  cmGeneratedFileStream *pcVar5;
  string buildFilePath;
  undefined1 local_41;
  undefined1 local_40 [48];
  
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)(local_40 + 0x10),(string *)psVar2);
  std::__cxx11::string::append((char *)(local_40 + 0x10));
  std::__cxx11::string::append(local_40 + 0x10);
  pcVar5 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar5 == (cmGeneratedFileStream *)0x0) {
    local_41 = None;
    local_40._12_4_ =
         (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])
                   (this);
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (bool *)(local_40 + 0x10),(Encoding *)&local_41);
    uVar1 = local_40._0_8_;
    local_40._0_8_ = (cmGeneratedFileStream *)0x0;
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->BuildFileStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)uVar1;
    if (pcVar5 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar5->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      if ((cmGeneratedFileStream *)local_40._0_8_ != (cmGeneratedFileStream *)0x0) {
        (**(code **)(*(long *)local_40._0_8_ + 8))();
      }
    }
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    if (((&(pcVar5->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)(pcVar5->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[0xfffffffffffffffd]] & 5) != 0) {
      bVar4 = false;
      goto LAB_0029afa7;
    }
  }
  WriteDisclaimer(this,(ostream *)pcVar5);
  poVar3 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# This file contains all the build statements describing the\n");
  bVar4 = true;
  std::operator<<(poVar3,"# compilation DAG.\n\n");
LAB_0029afa7:
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return bVar4;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream) {
    this->BuildFileStream = cm::make_unique<cmGeneratedFileStream>(
      buildFilePath, false, this->GetMakefileEncoding());
    if (!(*this->BuildFileStream)) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return false;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}